

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLock::ConstraintsFetch_react(ChLinkLock *this,double factor)

{
  ChVector<double> *pCVar1;
  ChVector<double> *pCVar2;
  ChConstraintVectorX *this_00;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ChMarker *pCVar28;
  ChMarker *pCVar29;
  ChLinkLimit *pCVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ChConstraintTwoBodies *pCVar33;
  Scalar *pSVar34;
  pointer ppCVar35;
  int i;
  int i_00;
  uint uVar36;
  ulong uVar37;
  int iVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  ChMatrix34<> Ts;
  ChGlMatrix34<double> Gl_q2;
  ChMatrix44<> qs_tilde;
  ChMatrix44<> Chi__q1p_barT;
  ChMatrix33<double> *local_2d0;
  double local_2c8;
  PlainObjectBase<Eigen::Matrix<double,3,4,1,3,4>> local_2c0 [8];
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  ulong local_278;
  ulong local_270;
  ulong local_268;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  local_248;
  ChGlMatrix34<double> local_220;
  DenseBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>_>
  local_1c0 [16];
  double local_1b0;
  non_const_type local_1a8;
  ChGlMatrix34<double> *local_198;
  undefined1 *local_190;
  double *local_188;
  double local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  double local_158;
  undefined8 local_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_130;
  undefined8 local_128;
  double local_120;
  undefined8 local_118;
  double local_110;
  double local_108;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  double local_d0;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  ulong local_b0;
  ulong uStack_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  
  dVar3 = DAT_011dd3e0;
  pCVar1 = &(this->super_ChLinkMarkers).super_ChLink.react_force;
  if (pCVar1 != (ChVector<double> *)&VNULL) {
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[0] = VNULL;
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1] = dVar3;
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2] = DAT_011dd3e8;
  }
  dVar3 = DAT_011dd3e0;
  pCVar2 = &(this->super_ChLinkMarkers).super_ChLink.react_torque;
  if (pCVar2 != (ChVector<double> *)&VNULL) {
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] = VNULL;
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = dVar3;
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = DAT_011dd3e8;
  }
  this_00 = &this->react;
  iVar38 = 0;
  for (i_00 = 0; i_00 < (this->mask).super_ChLinkMask.nconstr; i_00 = i_00 + 1) {
    pCVar33 = ChLinkMask::Constr_N(&(this->mask).super_ChLinkMask,i_00);
    if ((pCVar33->super_ChConstraintTwo).super_ChConstraint.active == true) {
      pCVar33 = ChLinkMask::Constr_N(&(this->mask).super_ChLinkMask,i_00);
      dVar3 = (pCVar33->super_ChConstraintTwo).super_ChConstraint.l_i;
      pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,
                           (long)iVar38);
      iVar38 = iVar38 + 1;
      *pSVar34 = factor * dVar3;
    }
  }
  pCVar28 = (this->super_ChLinkMarkers).marker1;
  pCVar29 = (this->super_ChLinkMarkers).marker2;
  local_f0 = *(undefined1 (*) [16])((pCVar28->abs_frame).super_ChFrame<double>.coord.rot.m_data + 2)
  ;
  local_d0 = (pCVar28->abs_frame).super_ChFrame<double>.coord.rot.m_data[3];
  auVar94._0_8_ = local_f0._0_8_ ^ 0x8000000000000000;
  auVar94._8_8_ = local_f0._8_8_ ^ 0x8000000000000000;
  auVar40._0_8_ = -local_d0;
  auVar40._8_8_ = 0x8000000000000000;
  local_c8 = vunpcklpd_avx(auVar94,local_f0);
  local_a0 = vshufpd_avx(local_f0,local_f0,1);
  local_b8 = vmovlpd_avx(auVar40);
  local_100 = *(undefined1 (*) [16])(pCVar28->abs_frame).super_ChFrame<double>.coord.rot.m_data;
  auVar68._0_8_ = local_100._0_8_ ^ 0x8000000000000000;
  uStack_a8 = local_100._8_8_;
  auVar68._8_8_ = uStack_a8 ^ 0x8000000000000000;
  local_e0 = vshufpd_avx(local_100,auVar68,1);
  local_90 = vshufps_avx(auVar68,auVar68,0x4e);
  local_180 = (pCVar29->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  auVar40 = *(undefined1 (*) [16])
             ((pCVar29->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data + 1);
  local_148 = (pCVar29->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  local_178._0_8_ = auVar40._0_8_ ^ 0x8000000000000000;
  local_178._8_8_ = auVar40._8_8_ ^ 0x8000000000000000;
  local_138 = (pCVar29->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar93._0_8_ = -local_138;
  auVar93._8_8_ = 0x8000000000000000;
  local_168 = vunpcklpd_avx(auVar93,auVar40);
  local_150 = vmovlpd_avx(auVar93);
  auVar40 = vshufps_avx(local_178,local_178,0x4e);
  local_128 = vmovlpd_avx(local_178);
  local_118 = vmovlpd_avx(auVar40);
  local_110 = (pCVar29->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_108 = (pCVar29->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  local_158 = local_180;
  dStack_140 = local_148;
  local_130 = local_180;
  local_120 = local_138;
  local_b0 = auVar68._0_8_;
  ChGlMatrix34<double>::ChGlMatrix34
            (&local_220,
             &(((this->super_ChLinkMarkers).super_ChLink.Body2)->super_ChFrameMoving<double>).
              super_ChFrame<double>.coord.rot);
  local_2c8 = 0.25;
  local_2d0 = &(pCVar29->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  Eigen::operator*(&local_248,&local_2c8,(StorageBaseType *)&local_2d0);
  local_198 = &local_220;
  local_1b0 = local_248.m_lhs.m_functor.m_other;
  local_1a8 = local_248.m_rhs.m_matrix;
  local_190 = local_100;
  local_188 = &local_180;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,4,1,3,4>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>const>const>,Eigen::Matrix<double,3,4,1,3,4>,0>,Eigen::Matrix<double,4,4,1,4,4>,0>,Eigen::Matrix<double,4,4,1,4,4>,0>>
            (local_2c0,local_1c0);
  ppCVar35 = (this->mask).super_ChLinkMask.constraints.
             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  bVar39 = ((*ppCVar35)->super_ChConstraintTwo).super_ChConstraint.active != false;
  if (bVar39) {
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,0);
    auVar41._0_8_ = -*pSVar34;
    auVar41._8_8_ = 0x8000000000000000;
    dVar3 = (double)vmovlpd_avx(auVar41);
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[0] = dVar3;
    dVar3 = (this->super_ChLinkMarkers).relM.pos.m_data[2];
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,0);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = -dVar3 * *pSVar34;
    dVar3 = (this->super_ChLinkMarkers).relM.pos.m_data[1];
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,0);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = dVar3 * *pSVar34;
    ppCVar35 = (this->mask).super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar37 = (ulong)bVar39;
  if ((ppCVar35[1]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *pSVar34;
    auVar31._8_8_ = 0x8000000000000000;
    auVar31._0_8_ = 0x8000000000000000;
    auVar40 = vxorpd_avx512vl(auVar42,auVar31);
    dVar3 = (double)vmovlpd_avx(auVar40);
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1] = dVar3;
    dVar3 = (this->super_ChLinkMarkers).relM.pos.m_data[2];
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] = dVar3 * *pSVar34;
    dVar3 = (this->super_ChLinkMarkers).relM.pos.m_data[0];
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar43._8_8_ = 0;
    auVar43._0_8_ = *pSVar34;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar3;
    uVar37 = (ulong)(bVar39 + 1);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
    auVar40 = vfnmadd213sd_fma(auVar43,auVar69,auVar4);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar40._0_8_;
    ppCVar35 = (this->mask).super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((ppCVar35[2]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar44._8_8_ = 0;
    auVar44._0_8_ = *pSVar34;
    auVar32._8_8_ = 0x8000000000000000;
    auVar32._0_8_ = 0x8000000000000000;
    auVar40 = vxorpd_avx512vl(auVar44,auVar32);
    dVar3 = (double)vmovlpd_avx(auVar40);
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2] = dVar3;
    dVar3 = (this->super_ChLinkMarkers).relM.pos.m_data[1];
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar45._8_8_ = 0;
    auVar45._0_8_ = *pSVar34;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar3;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0];
    auVar40 = vfnmadd213sd_fma(auVar45,auVar70,auVar5);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] = auVar40._0_8_;
    dVar3 = (this->super_ChLinkMarkers).relM.pos.m_data[0];
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar46._8_8_ = 0;
    auVar46._0_8_ = *pSVar34;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar3;
    uVar37 = (ulong)((int)uVar37 + 1);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
    auVar40 = vfmadd213sd_fma(auVar46,auVar71,auVar6);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar40._0_8_;
    ppCVar35 = (this->mask).super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((ppCVar35[4]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar47._8_8_ = 0;
    auVar47._0_8_ = *pSVar34;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_2b8;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0];
    auVar40 = vfmadd213sd_fma(auVar47,auVar72,auVar7);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] = auVar40._0_8_;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar48._8_8_ = 0;
    auVar48._0_8_ = *pSVar34;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_298;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
    auVar40 = vfmadd213sd_fma(auVar48,auVar73,auVar8);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar40._0_8_;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar49._8_8_ = 0;
    auVar49._0_8_ = *pSVar34;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_278;
    uVar37 = (ulong)((int)uVar37 + 1);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
    auVar40 = vfmadd213sd_fma(auVar49,auVar74,auVar9);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar40._0_8_;
    ppCVar35 = (this->mask).super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar36 = (uint)uVar37;
  if ((ppCVar35[5]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar50._8_8_ = 0;
    auVar50._0_8_ = *pSVar34;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_2b0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0];
    auVar40 = vfmadd213sd_fma(auVar50,auVar75,auVar10);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] = auVar40._0_8_;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar51._8_8_ = 0;
    auVar51._0_8_ = *pSVar34;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_290;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
    auVar40 = vfmadd213sd_fma(auVar51,auVar76,auVar11);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar40._0_8_;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar52._8_8_ = 0;
    auVar52._0_8_ = *pSVar34;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_270;
    uVar36 = uVar36 + 1;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
    auVar40 = vfmadd213sd_fma(auVar52,auVar77,auVar12);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar40._0_8_;
    ppCVar35 = (this->mask).super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((ppCVar35[6]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    uVar37 = (ulong)uVar36;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar53._8_8_ = 0;
    auVar53._0_8_ = *pSVar34;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_2a8;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0];
    auVar40 = vfmadd213sd_fma(auVar53,auVar78,auVar13);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] = auVar40._0_8_;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar54._8_8_ = 0;
    auVar54._0_8_ = *pSVar34;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_288;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
    auVar40 = vfmadd213sd_fma(auVar54,auVar79,auVar14);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar40._0_8_;
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)this_00,uVar37
                        );
    auVar55._8_8_ = 0;
    auVar55._0_8_ = *pSVar34;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = local_268;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
    auVar40 = vfmadd213sd_fma(auVar55,auVar80,auVar15);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar40._0_8_;
  }
  pCVar30 = (this->limit_X)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar30 != (ChLinkLimit *)0x0) && (pCVar30->m_active == true)) {
    if (*(bool *)((long)&(pCVar30->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar56._8_8_ = 0;
      auVar56._0_8_ = *(double *)((long)&(pCVar30->constr_lower).super_ChConstraintTwo + 0x10);
      auVar81._8_8_ = 0;
      auVar81._0_8_ = factor;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = pCVar1->m_data[0];
      auVar40 = vfnmadd213sd_fma(auVar56,auVar81,auVar16);
      pCVar1->m_data[0] = auVar40._0_8_;
    }
    if (*(bool *)((long)&(pCVar30->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *(double *)((long)&(pCVar30->constr_upper).super_ChConstraintTwo + 0x10);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = factor;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = pCVar1->m_data[0];
      auVar40 = vfmadd213sd_fma(auVar57,auVar82,auVar17);
      pCVar1->m_data[0] = auVar40._0_8_;
    }
  }
  pCVar30 = (this->limit_Y)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar30 != (ChLinkLimit *)0x0) && (pCVar30->m_active == true)) {
    if (*(bool *)((long)&(pCVar30->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar58._8_8_ = 0;
      auVar58._0_8_ = *(double *)((long)&(pCVar30->constr_lower).super_ChConstraintTwo + 0x10);
      auVar83._8_8_ = 0;
      auVar83._0_8_ = factor;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1];
      auVar40 = vfnmadd213sd_fma(auVar58,auVar83,auVar18);
      (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1] = auVar40._0_8_;
    }
    if (*(bool *)((long)&(pCVar30->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar59._8_8_ = 0;
      auVar59._0_8_ = *(double *)((long)&(pCVar30->constr_upper).super_ChConstraintTwo + 0x10);
      auVar84._8_8_ = 0;
      auVar84._0_8_ = factor;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1];
      auVar40 = vfmadd213sd_fma(auVar59,auVar84,auVar19);
      (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1] = auVar40._0_8_;
    }
  }
  pCVar30 = (this->limit_Z)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar30 != (ChLinkLimit *)0x0) && (pCVar30->m_active == true)) {
    if (*(bool *)((long)&(pCVar30->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(double *)((long)&(pCVar30->constr_lower).super_ChConstraintTwo + 0x10);
      auVar85._8_8_ = 0;
      auVar85._0_8_ = factor;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2];
      auVar40 = vfnmadd213sd_fma(auVar60,auVar85,auVar20);
      (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2] = auVar40._0_8_;
    }
    if (*(bool *)((long)&(pCVar30->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *(double *)((long)&(pCVar30->constr_upper).super_ChConstraintTwo + 0x10);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = factor;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2];
      auVar40 = vfmadd213sd_fma(auVar61,auVar86,auVar21);
      (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2] = auVar40._0_8_;
    }
  }
  pCVar30 = (this->limit_Rx)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar30 != (ChLinkLimit *)0x0) && (pCVar30->m_active == true)) {
    if (*(bool *)((long)&(pCVar30->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar62._8_8_ = 0;
      auVar62._0_8_ = *(double *)((long)&(pCVar30->constr_lower).super_ChConstraintTwo + 0x10);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = pCVar2->m_data[0];
      auVar87._8_8_ = 0;
      auVar87._0_8_ = factor * -0.5;
      auVar40 = vfmadd213sd_fma(auVar87,auVar62,auVar22);
      pCVar2->m_data[0] = auVar40._0_8_;
    }
    if (*(bool *)((long)&(pCVar30->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar88._8_8_ = 0;
      auVar88._0_8_ = *(double *)((long)&(pCVar30->constr_upper).super_ChConstraintTwo + 0x10);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = pCVar2->m_data[0];
      auVar63._8_8_ = 0;
      auVar63._0_8_ = factor * 0.5;
      auVar40 = vfmadd213sd_fma(auVar88,auVar63,auVar23);
      pCVar2->m_data[0] = auVar40._0_8_;
    }
  }
  pCVar30 = (this->limit_Ry)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar30 != (ChLinkLimit *)0x0) && (pCVar30->m_active == true)) {
    if (*(bool *)((long)&(pCVar30->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar64._8_8_ = 0;
      auVar64._0_8_ = *(double *)((long)&(pCVar30->constr_lower).super_ChConstraintTwo + 0x10);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
      auVar89._8_8_ = 0;
      auVar89._0_8_ = factor * -0.5;
      auVar40 = vfmadd213sd_fma(auVar89,auVar64,auVar24);
      (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar40._0_8_;
    }
    if (*(bool *)((long)&(pCVar30->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar90._8_8_ = 0;
      auVar90._0_8_ = *(double *)((long)&(pCVar30->constr_upper).super_ChConstraintTwo + 0x10);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
      auVar65._8_8_ = 0;
      auVar65._0_8_ = factor * 0.5;
      auVar40 = vfmadd213sd_fma(auVar90,auVar65,auVar25);
      (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar40._0_8_;
    }
  }
  pCVar30 = (this->limit_Rz)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar30 != (ChLinkLimit *)0x0) && (pCVar30->m_active == true)) {
    if (*(bool *)((long)&(pCVar30->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar66._8_8_ = 0;
      auVar66._0_8_ = *(double *)((long)&(pCVar30->constr_lower).super_ChConstraintTwo + 0x10);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
      auVar91._8_8_ = 0;
      auVar91._0_8_ = factor * -0.5;
      auVar40 = vfmadd213sd_fma(auVar91,auVar66,auVar26);
      (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar40._0_8_;
    }
    if (*(bool *)((long)&(pCVar30->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar92._8_8_ = 0;
      auVar92._0_8_ = *(double *)((long)&(pCVar30->constr_upper).super_ChConstraintTwo + 0x10);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
      auVar67._8_8_ = 0;
      auVar67._0_8_ = factor * 0.5;
      auVar40 = vfmadd213sd_fma(auVar92,auVar67,auVar27);
      (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar40._0_8_;
    }
  }
  return;
}

Assistant:

void ChLinkLock::ConstraintsFetch_react(double factor) {
    react_force = VNULL;
    react_torque = VNULL;

    // From constraints to react vector:
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            react(cnt) = mask.Constr_N(i).Get_l_i() * factor;
            cnt++;
        }
    }

    // From react vector to the 'intuitive' react_force and react_torque
    const ChQuaternion<>& q2 = Body2->GetRot();
    const ChQuaternion<>& q1p = marker1->GetAbsCoord().rot;
    const ChQuaternion<>& qs = marker2->GetCoord().rot;
    const ChMatrix33<>& Cs = marker2->GetA();

    ChMatrix44<> Chi__q1p_barT;  //[Chi] * [transpose(bar(q1p))]
    Chi__q1p_barT(0, 0) = q1p.e0();
    Chi__q1p_barT(0, 1) = q1p.e1();
    Chi__q1p_barT(0, 2) = q1p.e2();
    Chi__q1p_barT(0, 3) = q1p.e3();
    Chi__q1p_barT(1, 0) = q1p.e1();
    Chi__q1p_barT(1, 1) = -q1p.e0();
    Chi__q1p_barT(1, 2) = q1p.e3();
    Chi__q1p_barT(1, 3) = -q1p.e2();
    Chi__q1p_barT(2, 0) = q1p.e2();
    Chi__q1p_barT(2, 1) = -q1p.e3();
    Chi__q1p_barT(2, 2) = -q1p.e0();
    Chi__q1p_barT(2, 3) = q1p.e1();
    Chi__q1p_barT(3, 0) = q1p.e3();
    Chi__q1p_barT(3, 1) = q1p.e2();
    Chi__q1p_barT(3, 2) = -q1p.e1();
    Chi__q1p_barT(3, 3) = -q1p.e0();

    ChMatrix44<> qs_tilde;
    qs_tilde(0, 0) = qs.e0();
    qs_tilde(0, 1) = -qs.e1();
    qs_tilde(0, 2) = -qs.e2();
    qs_tilde(0, 3) = -qs.e3();
    qs_tilde(1, 0) = qs.e1();
    qs_tilde(1, 1) = qs.e0();
    qs_tilde(1, 2) = -qs.e3();
    qs_tilde(1, 3) = qs.e2();
    qs_tilde(2, 0) = qs.e2();
    qs_tilde(2, 1) = qs.e3();
    qs_tilde(2, 2) = qs.e0();
    qs_tilde(2, 3) = -qs.e1();
    qs_tilde(3, 0) = qs.e3();
    qs_tilde(3, 1) = -qs.e2();
    qs_tilde(3, 2) = qs.e1();
    qs_tilde(3, 3) = qs.e0();

    // Ts = 0.5*CsT*G(q2)*Chi*(q1 qp)_barT*qs~*KT*lambda
    ChGlMatrix34<> Gl_q2(q2);
    ChMatrix34<> Ts = 0.25 * Cs.transpose() * Gl_q2 * Chi__q1p_barT * qs_tilde;

    // Translational constraint reaction force = -lambda_translational
    // Translational constraint reaction torque = -d~''(t)*lambda_translational
    // No reaction force from the rotational constraints

    int n_constraint = 0;

    if (mask.Constr_X().IsActive()) {
        react_force.x() = -react(n_constraint);
        react_torque.y() = -relM.pos.z() * react(n_constraint);
        react_torque.z() = relM.pos.y() * react(n_constraint);
        n_constraint++;
    }
    if (mask.Constr_Y().IsActive()) {
        react_force.y() = -react(n_constraint);
        react_torque.x() = relM.pos.z() * react(n_constraint);
        react_torque.z() += -relM.pos.x() * react(n_constraint);
        n_constraint++;
    }
    if (mask.Constr_Z().IsActive()) {
        react_force.z() = -react(n_constraint);
        react_torque.x() += -relM.pos.y() * react(n_constraint);
        react_torque.y() += relM.pos.x() * react(n_constraint);
        n_constraint++;
    }

    if (mask.Constr_E1().IsActive()) {
        react_torque.x() += Ts(0, 1) * (react(n_constraint));
        react_torque.y() += Ts(1, 1) * (react(n_constraint));
        react_torque.z() += Ts(2, 1) * (react(n_constraint));
        n_constraint++;
    }
    if (mask.Constr_E2().IsActive()) {
        react_torque.x() += Ts(0, 2) * (react(n_constraint));
        react_torque.y() += Ts(1, 2) * (react(n_constraint));
        react_torque.z() += Ts(2, 2) * (react(n_constraint));
        n_constraint++;
    }
    if (mask.Constr_E3().IsActive()) {
        react_torque.x() += Ts(0, 3) * (react(n_constraint));
        react_torque.y() += Ts(1, 3) * (react(n_constraint));
        react_torque.z() += Ts(2, 3) * (react(n_constraint));
        n_constraint++;
    }

    // ***TO DO***?: TRANSFORMATION FROM delta COORDS TO LINK COORDS, if
    // non-default delta
    // if delta rotation?

    // add also the contribution from link limits to the react_force and
    // react_torque.
    if (limit_X && limit_X->IsActive()) {
        if (limit_X->constr_lower.IsActive()) {
            react_force.x() -= factor * limit_X->constr_lower.Get_l_i();
        }
        if (limit_X->constr_upper.IsActive()) {
            react_force.x() += factor * limit_X->constr_upper.Get_l_i();
        }
    }
    if (limit_Y && limit_Y->IsActive()) {
        if (limit_Y->constr_lower.IsActive()) {
            react_force.y() -= factor * limit_Y->constr_lower.Get_l_i();
        }
        if (limit_Y->constr_upper.IsActive()) {
            react_force.y() += factor * limit_Y->constr_upper.Get_l_i();
        }
    }
    if (limit_Z && limit_Z->IsActive()) {
        if (limit_Z->constr_lower.IsActive()) {
            react_force.z() -= factor * limit_Z->constr_lower.Get_l_i();
        }
        if (limit_Z->constr_upper.IsActive()) {
            react_force.z() += factor * limit_Z->constr_upper.Get_l_i();
        }
    }
    if (limit_Rx && limit_Rx->IsActive()) {
        if (limit_Rx->constr_lower.IsActive()) {
            react_torque.x() -= 0.5 * factor * limit_Rx->constr_lower.Get_l_i();
        }
        if (limit_Rx->constr_upper.IsActive()) {
            react_torque.x() += 0.5 * factor * limit_Rx->constr_upper.Get_l_i();
        }
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        if (limit_Ry->constr_lower.IsActive()) {
            react_torque.y() -= 0.5 * factor * limit_Ry->constr_lower.Get_l_i();
        }
        if (limit_Ry->constr_upper.IsActive()) {
            react_torque.y() += 0.5 * factor * limit_Ry->constr_upper.Get_l_i();
        }
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        if (limit_Rz->constr_lower.IsActive()) {
            react_torque.z() -= 0.5 * factor * limit_Rz->constr_lower.Get_l_i();
        }
        if (limit_Rz->constr_upper.IsActive()) {
            react_torque.z() += 0.5 * factor * limit_Rz->constr_upper.Get_l_i();
        }
    }

    // the internal forces add their contribute to the reactions
    // NOT NEEDED?, since C_force and react_force must stay separated???
    // react_force  = Vadd(react_force, C_force);
    // react_torque = Vadd(react_torque, C_torque);
}